

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall
TTD::EventLog::RecordJsRTConstructCall
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,Var funcVar,uint32 argCount,
          Var *args)

{
  EventLogEntry *actionEvent;
  void **ppvVar1;
  EventLogEntry *evt;
  JsRTConstructCallAction *ccAction;
  Var *args_local;
  Var pvStack_20;
  uint32 argCount_local;
  Var funcVar_local;
  TTDJsRTActionResultAutoRecorder *actionPopper_local;
  EventLog *this_local;
  
  evt = (EventLogEntry *)0x0;
  ccAction = (JsRTConstructCallAction *)args;
  args_local._4_4_ = argCount;
  pvStack_20 = funcVar;
  funcVar_local = actionPopper;
  actionPopper_local = (TTDJsRTActionResultAutoRecorder *)this;
  actionEvent = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTConstructCallAction,(TTD::NSLogEvents::EventKind)66>
                          (this,(JsRTConstructCallAction **)&evt);
  *(uint32 *)&evt->EventTimeStamp = args_local._4_4_ + 1;
  ppvVar1 = SlabAllocatorBase<8>::SlabAllocateArray<void*>
                      (&this->m_eventSlabAllocator,(ulong)(uint)evt->EventTimeStamp);
  *(void ***)(evt + 1) = ppvVar1;
  **(undefined8 **)(evt + 1) = pvStack_20;
  js_memcpy_s((void *)(*(long *)(evt + 1) + 8),(ulong)((int)evt->EventTimeStamp - 1) << 3,ccAction,
              (ulong)args_local._4_4_ << 3);
  TTDJsRTActionResultAutoRecorder::InitializeWithEventAndEnterWResult
            ((TTDJsRTActionResultAutoRecorder *)funcVar_local,actionEvent,(TTDVar *)evt);
  return;
}

Assistant:

void EventLog::RecordJsRTConstructCall(TTDJsRTActionResultAutoRecorder& actionPopper, Js::Var funcVar, uint32 argCount, Js::Var* args)
    {
        NSLogEvents::JsRTConstructCallAction* ccAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTConstructCallAction, NSLogEvents::EventKind::ConstructCallActionTag>(&ccAction);

        ccAction->ArgCount = argCount + 1;

        static_assert(sizeof(TTDVar) == sizeof(Js::Var), "These need to be the same size (and have same bit layout) for this to work!");

        ccAction->ArgArray = this->m_eventSlabAllocator.SlabAllocateArray<TTDVar>(ccAction->ArgCount);
        ccAction->ArgArray[0] = TTD_CONVERT_JSVAR_TO_TTDVAR(funcVar);
        js_memcpy_s(ccAction->ArgArray + 1, (ccAction->ArgCount - 1) * sizeof(TTDVar), args, argCount * sizeof(Js::Var));

        actionPopper.InitializeWithEventAndEnterWResult(evt, &(ccAction->Result));
    }